

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticModel.cpp
# Opt level: O1

StructDeclarationSymbol * __thiscall
psy::C::SemanticModel::structFor(SemanticModel *this,StructOrUnionDeclarationSyntax *node)

{
  SymbolKind SVar1;
  SyntaxKind SVar2;
  int iVar3;
  Symbol *this_00;
  undefined4 extraout_var;
  ostream *poVar4;
  
  SVar2 = SyntaxNode::kind((SyntaxNode *)node);
  if (SVar2 == StructDeclaration) {
    this_00 = (Symbol *)typeDeclarationFor(this,(TypeDeclarationSyntax *)node);
    SVar1 = Symbol::kind(this_00);
    if (SVar1 == StructDeclaration) {
      iVar3 = (*this_00->_vptr_Symbol[0x1f])(this_00);
      return (StructDeclarationSymbol *)CONCAT44(extraout_var,iVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[ASSERT] at ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/SemanticModel.cpp"
               ,0x5c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xc4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"<empty message>",0xf);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
  }
  return (StructDeclarationSymbol *)0x0;
}

Assistant:

const StructDeclarationSymbol* SemanticModel::structFor(
        const StructOrUnionDeclarationSyntax* node) const
{
    if (node->kind() != SyntaxKind::StructDeclaration)
        return nullptr;
    auto tyDecl = typeDeclarationFor(node);
    PSY_ASSERT_2(tyDecl->kind() == SymbolKind::StructDeclaration, return nullptr);
    return tyDecl->asStructDeclaration();
}